

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O3

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueLittleUInt32::read
          (PLYValueLittleUInt32 *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  undefined4 in_register_00000034;
  long *plVar6;
  
  plVar6 = (long *)CONCAT44(in_register_00000034,__fd);
  pbVar3 = (byte *)plVar6[2];
  pbVar4 = (byte *)plVar6[3];
  if (pbVar3 < pbVar4) {
    bVar1 = *pbVar3;
    pbVar3 = pbVar3 + 1;
    plVar6[2] = (long)pbVar3;
  }
  else {
    bVar1 = (**(code **)(*plVar6 + 0x50))(plVar6);
    pbVar3 = (byte *)plVar6[2];
    pbVar4 = (byte *)plVar6[3];
  }
  uVar5 = (uint)bVar1;
  this->value = (uint)bVar1;
  if (pbVar3 < pbVar4) {
    uVar2 = (uint)*pbVar3;
    pbVar3 = pbVar3 + 1;
    plVar6[2] = (long)pbVar3;
  }
  else {
    uVar2 = (**(code **)(*plVar6 + 0x50))(plVar6);
    uVar5 = this->value;
    pbVar3 = (byte *)plVar6[2];
    pbVar4 = (byte *)plVar6[3];
  }
  uVar5 = (uVar2 & 0xff) << 8 | uVar5;
  this->value = uVar5;
  if (pbVar3 < pbVar4) {
    bVar1 = *pbVar3;
    pbVar3 = pbVar3 + 1;
    plVar6[2] = (long)pbVar3;
  }
  else {
    bVar1 = (**(code **)(*plVar6 + 0x50))(plVar6);
    uVar5 = this->value;
    pbVar3 = (byte *)plVar6[2];
    pbVar4 = (byte *)plVar6[3];
  }
  uVar5 = (uint)bVar1 << 0x10 | uVar5;
  this->value = uVar5;
  if (pbVar3 < pbVar4) {
    uVar2 = (uint)*pbVar3;
    plVar6[2] = (long)(pbVar3 + 1);
  }
  else {
    uVar2 = (**(code **)(*plVar6 + 0x50))(plVar6);
    uVar5 = this->value;
  }
  uVar5 = uVar2 << 0x18 | uVar5;
  this->value = uVar5;
  return (ulong)uVar5;
}

Assistant:

void read(std::streambuf *in)
    {
      value=in->sbumpc()&0xff;
      value|=(in->sbumpc()&0xff)<<8;
      value|=(in->sbumpc()&0xff)<<16;
      value|=(in->sbumpc()&0xff)<<24;
    }